

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O2

void ut::
     are_not_equal<agge::tests::(anonymous_namespace)::B_const*,agge::tests::(anonymous_namespace)::B_const*>
               (B **expected,B **actual,LocationInfo *location)

{
  FailedAssertion *this;
  allocator local_39;
  string local_38;
  
  if (*expected != *actual) {
    return;
  }
  this = (FailedAssertion *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string((string *)&local_38,"Values are equal!",&local_39);
  FailedAssertion::FailedAssertion(this,&local_38,location);
  __cxa_throw(this,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void are_not_equal(const T1 &expected, const T2 &actual, const LocationInfo &location)
	{
		if (!(expected != actual))
			throw FailedAssertion("Values are equal!", location);
	}